

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_know_alignment(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar2 = get_align((CHAR_DATA *)vo);
  pcVar3 = "$N is the embodiment of pure evil!.";
  if (iVar2 == 0) {
    pcVar3 = "$N doesn\'t have a firm moral commitment.";
  }
  pcVar4 = "$N has a pure and good aura.";
  if (iVar2 < 1) {
    pcVar4 = pcVar3;
  }
  act(pcVar4,ch,(void *)0x0,vo,3);
  bVar1 = is_npc((CHAR_DATA *)vo);
  if (!bVar1) {
    iVar2 = get_ethos((CHAR_DATA *)vo);
  }
  pcVar3 = "$N has absolutely no cares for the law.";
  if (iVar2 == 0) {
    pcVar3 = "$N doesn\'t know what to think about the law";
  }
  pcVar4 = "$N abides by the law of the land.";
  if (iVar2 < 1) {
    pcVar4 = pcVar3;
  }
  act(pcVar4,ch,(void *)0x0,vo,3);
  return;
}

Assistant:

void spell_know_alignment(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	char *msg;
	int ap;

	ap = get_align(victim);

	if (ap > 0)
		msg = "$N has a pure and good aura.";
	else if (ap == 0)
		msg = "$N doesn't have a firm moral commitment.";
	else
		msg = "$N is the embodiment of pure evil!.";

	act(msg, ch, nullptr, victim, TO_CHAR);

	if (!is_npc(victim))
		ap = get_ethos(victim);

	if (ap > 0)
		msg = "$N abides by the law of the land.";
	else if (ap == 0)
		msg = "$N doesn't know what to think about the law";
	else
		msg = "$N has absolutely no cares for the law.";

	act(msg, ch, nullptr, victim, TO_CHAR);
	return;
}